

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall wabt::WastParser::ParseFuncModuleField(WastParser *this,Module *module)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  Result RVar2;
  Index binding_index_offset;
  pointer pFVar3;
  pointer pFVar4;
  size_type sVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c8;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> local_1b0;
  Enum local_1a8;
  Enum local_1a4;
  undefined1 local_1a0 [8];
  TypeVector local_types;
  Func *func_1;
  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_> field_1;
  Location local_168;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> local_148;
  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_> field;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  string asStack_118 [32];
  string asStack_f8 [32];
  iterator local_d8;
  size_type local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  Enum local_b0;
  Enum local_ac;
  Enum local_a8;
  Enum local_a4;
  Func *local_a0;
  Func *func;
  unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> import;
  undefined1 local_88 [8];
  ModuleFieldList export_fields;
  string name;
  undefined1 local_48 [8];
  Location loc;
  Module *module_local;
  WastParser *this_local;
  
  loc.field_1._12_4_ = Expect(this,Lpar);
  bVar1 = Failed((Result)loc.field_1._12_4_);
  if (bVar1) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    GetLocation((Location *)local_48,this);
    RVar2 = Expect(this,First_RefKind);
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      std::__cxx11::string::string((string *)&export_fields.size_);
      ParseBindVarOpt(this,(string *)&export_fields.size_);
      intrusive_list<wabt::ModuleField>::intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_88);
      import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
      _M_t.super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
      super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_ =
           ParseInlineExports(this,(ModuleFieldList *)local_88,First);
      bVar1 = Failed(import._M_t.
                     super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                     .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._4_4_);
      if (bVar1) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        import._M_t.super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
        _M_t.super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
        super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
      }
      else {
        bVar1 = PeekMatchLpar(this,Import);
        if (bVar1) {
          CheckImportOrdering(this,module);
          MakeUnique<wabt::FuncImport,std::__cxx11::string&>
                    ((wabt *)&func,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &export_fields.size_);
          pFVar3 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::
                   operator->((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                               *)&func);
          local_a0 = &pFVar3->func;
          pFVar3 = std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::get
                             ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>
                               *)&func);
          local_a4 = (Enum)ParseInlineImport(this,(Import *)pFVar3);
          bVar1 = Failed((Result)local_a4);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            local_a8 = (Enum)ParseTypeUseOpt(this,&local_a0->decl);
            bVar1 = Failed((Result)local_a8);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
              super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              local_ac = (Enum)ParseFuncSignature(this,&(local_a0->decl).sig,&local_a0->bindings);
              bVar1 = Failed((Result)local_ac);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t
                .super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_138,"type",
                           (allocator *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 7));
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (asStack_118,"param",
                           (allocator *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 6));
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          (asStack_f8,"result",
                           (allocator *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 5));
                local_d8 = &local_138;
                local_d0 = 3;
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)((long)&field._M_t.
                                       super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                       .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                       _M_head_impl + 4));
                __l._M_len = local_d0;
                __l._M_array = local_d8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector(&local_c8,__l,
                         (allocator_type *)
                         ((long)&field._M_t.
                                 super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                 .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                 _M_head_impl + 4));
                local_b0 = (Enum)ErrorIfLpar(this,&local_c8,(char *)0x0);
                bVar1 = Failed((Result)local_b0);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_c8);
                std::
                allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)((long)&field._M_t.
                                        super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                        .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                        _M_head_impl + 4));
                local_1c8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_d8;
                do {
                  local_1c8 = local_1c8 + -1;
                  std::__cxx11::string::~string((string *)local_1c8);
                } while (local_1c8 != &local_138);
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 5));
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 6));
                std::allocator<char>::~allocator
                          ((allocator<char> *)
                           ((long)&field._M_t.
                                   super___uniq_ptr_impl<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wabt::ImportModuleField_*,_std::default_delete<wabt::ImportModuleField>_>
                                   .super__Head_base<0UL,_wabt::ImportModuleField_*,_false>.
                                   _M_head_impl + 7));
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
                }
                else {
                  GetLocation(&local_168,this);
                  MakeUnique<wabt::ImportModuleField,std::unique_ptr<wabt::FuncImport,std::default_delete<wabt::FuncImport>>,wabt::Location>
                            ((wabt *)&local_148,
                             (unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *
                             )&func,&local_168);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                *)&field_1,&local_148);
                  Module::AppendField(module,(unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                              *)&field_1);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::~unique_ptr((unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                                 *)&field_1);
                  std::
                  unique_ptr<wabt::ImportModuleField,_std::default_delete<wabt::ImportModuleField>_>
                  ::~unique_ptr(&local_148);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 0;
                }
              }
            }
          }
          std::unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>::~unique_ptr
                    ((unique_ptr<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_> *)&func);
        }
        else {
          MakeUnique<wabt::FuncModuleField,wabt::Location&,std::__cxx11::string&>
                    ((wabt *)&func_1,(Location *)local_48,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &export_fields.size_);
          pFVar4 = std::
                   unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                   operator->((unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                               *)&func_1);
          local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ =
               ParseTypeUseOpt(this,&(pFVar4->func).decl);
          bVar1 = Failed(local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ =
                 ParseFuncSignature(this,&(pFVar4->func).decl.sig,&(pFVar4->func).bindings);
            bVar1 = Failed(local_types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
            if (bVar1) {
              Result::Result((Result *)((long)&this_local + 4),Error);
              import._M_t.
              super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
              super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
              super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
            }
            else {
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_1a0);
              binding_index_offset = Func::GetNumParams(&pFVar4->func);
              local_1a4 = (Enum)ParseBoundValueTypeList
                                          (this,Local,(TypeVector *)local_1a0,
                                           &(pFVar4->func).bindings,binding_index_offset);
              bVar1 = Failed((Result)local_1a4);
              if (bVar1) {
                Result::Result((Result *)((long)&this_local + 4),Error);
                import._M_t.
                super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t
                .super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
              }
              else {
                LocalTypes::Set(&(pFVar4->func).local_types,(TypeVector *)local_1a0);
                local_1a8 = (Enum)ParseTerminatingInstrList(this,&(pFVar4->func).exprs);
                bVar1 = Failed((Result)local_1a8);
                if (bVar1) {
                  Result::Result((Result *)((long)&this_local + 4),Error);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
                }
                else {
                  std::
                  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                  unique_ptr(&local_1b0,
                             (unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                              *)&func_1);
                  Module::AppendField(module,&local_1b0);
                  std::
                  unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
                  ~unique_ptr(&local_1b0);
                  import._M_t.
                  super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>
                  .super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 0;
                }
              }
              std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
                        ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_1a0);
            }
          }
          std::unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>::
          ~unique_ptr((unique_ptr<wabt::FuncModuleField,_std::default_delete<wabt::FuncModuleField>_>
                       *)&func_1);
        }
        if ((int)import._M_t.
                 super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
                 super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl == 0) {
          sVar5 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::size(&module->funcs);
          anon_unknown_1::AppendInlineExportFields
                    (module,(ModuleFieldList *)local_88,(int)sVar5 - 1);
          RVar2 = Expect(this,Rpar);
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
          else {
            Result::Result((Result *)((long)&this_local + 4),Ok);
            import._M_t.
            super___uniq_ptr_impl<wabt::FuncImport,_std::default_delete<wabt::FuncImport>_>._M_t.
            super__Tuple_impl<0UL,_wabt::FuncImport_*,_std::default_delete<wabt::FuncImport>_>.
            super__Head_base<0UL,_wabt::FuncImport_*,_false>._M_head_impl._0_4_ = 1;
          }
        }
      }
      intrusive_list<wabt::ModuleField>::~intrusive_list
                ((intrusive_list<wabt::ModuleField> *)local_88);
      std::__cxx11::string::~string((string *)&export_fields.size_);
    }
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseFuncModuleField(Module* module) {
  WABT_TRACE(ParseFuncModuleField);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Func);
  std::string name;
  ParseBindVarOpt(&name);

  ModuleFieldList export_fields;
  CHECK_RESULT(ParseInlineExports(&export_fields, ExternalKind::Func));

  if (PeekMatchLpar(TokenType::Import)) {
    CheckImportOrdering(module);
    auto import = MakeUnique<FuncImport>(name);
    Func& func = import->func;
    CHECK_RESULT(ParseInlineImport(import.get()));
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    CHECK_RESULT(ErrorIfLpar({"type", "param", "result"}));
    auto field =
        MakeUnique<ImportModuleField>(std::move(import), GetLocation());
    module->AppendField(std::move(field));
  } else {
    auto field = MakeUnique<FuncModuleField>(loc, name);
    Func& func = field->func;
    CHECK_RESULT(ParseTypeUseOpt(&func.decl));
    CHECK_RESULT(ParseFuncSignature(&func.decl.sig, &func.bindings));
    TypeVector local_types;
    CHECK_RESULT(ParseBoundValueTypeList(TokenType::Local, &local_types,
                                         &func.bindings, func.GetNumParams()));
    func.local_types.Set(local_types);
    CHECK_RESULT(ParseTerminatingInstrList(&func.exprs));
    module->AppendField(std::move(field));
  }

  AppendInlineExportFields(module, &export_fields, module->funcs.size() - 1);

  EXPECT(Rpar);
  return Result::Ok;
}